

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O1

bool __thiscall
slang::ast::MemberAccessExpression::requireLValueImpl
          (MemberAccessExpression *this,ASTContext *context,SourceLocation location,
          bitmask<slang::ast::AssignFlags> flags,Expression *longestStaticPrefix)

{
  Type *pTVar1;
  Scope *pSVar2;
  bool bVar3;
  uint uVar4;
  Diagnostic *pDVar5;
  Symbol *pSVar6;
  NetSymbol *net;
  undefined1 in_stack_00000008 [16];
  
  pTVar1 = (this->value_->type).ptr;
  if (pTVar1->canonical == (Type *)0x0) {
    Type::resolveCanonical(pTVar1);
  }
  pTVar1 = pTVar1->canonical;
  if (pTVar1->canonical == (Type *)0x0) {
    Type::resolveCanonical(pTVar1);
  }
  if ((((pTVar1->canonical->super_Symbol).kind == ClassType) ||
      ((pTVar1->canonical->super_Symbol).kind == CovergroupType)) ||
     ((pTVar1->canonical->super_Symbol).kind == VoidType)) {
    uVar4 = (((ValueSymbol *)this->member)->super_Symbol).kind - Variable;
    if ((uVar4 < 0x19) && ((0x1800c0fU >> (uVar4 & 0x1f) & 1) != 0)) {
      if (longestStaticPrefix == (Expression *)0x0) {
        longestStaticPrefix = &this->super_Expression;
      }
      ASTContext::addDriver(context,(ValueSymbol *)this->member,longestStaticPrefix,flags);
      bVar3 = ValueExpressionBase::checkVariableAssignment
                        ((ValueExpressionBase *)context,(ASTContext *)this->member,
                         (VariableSymbol *)(ulong)flags.m_bits,
                         (bitmask<slang::ast::AssignFlags>)location._0_1_,
                         (this->super_Expression).sourceRange.startLoc,
                         (SourceRange)in_stack_00000008);
      return bVar3;
    }
    if (((ulong)location & 0xfffffff) == 0) {
      location = (this->super_Expression).sourceRange.startLoc;
    }
    pDVar5 = ASTContext::addDiag(context,(DiagCode)0x560007,location);
    Diagnostic::addNote(pDVar5,(DiagCode)0x50001,this->member->location);
    Diagnostic::operator<<(pDVar5,(this->super_Expression).sourceRange);
    return false;
  }
  pSVar6 = this->member;
  uVar4 = pSVar6->kind - Variable;
  if (((uVar4 < 0x19) && ((0x1800c0fU >> (uVar4 & 0x1f) & 1) != 0)) &&
     (((ulong)pSVar6[5].name._M_str & 0x400000000) != 0)) {
    do {
      pSVar2 = pSVar6->parentScope;
      if (pSVar2 == (Scope *)0x0) goto LAB_0039cf60;
      pSVar6 = pSVar2->thisSym;
    } while ((2 < pSVar6->kind - CovergroupBody) && (pSVar6->kind != CovergroupType));
    if (pSVar2 != (context->scope).ptr) {
LAB_0039cf60:
      pDVar5 = ASTContext::addDiag(context,(DiagCode)0x450007,location);
      Diagnostic::operator<<(pDVar5,this->member->name);
      return false;
    }
  }
  pSVar6 = Expression::getSymbolReference(this->value_,true);
  if (((pSVar6 != (Symbol *)0x0) && (pSVar6->kind == Net)) &&
     (*(int *)(pSVar6[5].name._M_str + 0x80) == 0xe)) {
    pDVar5 = ASTContext::addDiag(context,(DiagCode)0xa80007,(this->super_Expression).sourceRange);
    Diagnostic::operator<<(pDVar5,pSVar6->name);
  }
  if (longestStaticPrefix == (Expression *)0x0) {
    longestStaticPrefix = &this->super_Expression;
  }
  bVar3 = Expression::requireLValue(this->value_,context,location,flags,longestStaticPrefix);
  return bVar3;
}

Assistant:

bool MemberAccessExpression::requireLValueImpl(const ASTContext& context, SourceLocation location,
                                               bitmask<AssignFlags> flags,
                                               const Expression* longestStaticPrefix) const {
    // If this is a selection of a class or covergroup member, assignability depends only
    // on the selected member and not on the handle itself. Otherwise, the opposite is true.
    auto& valueType = value().type->getCanonicalType();
    if (valueType.isClass() || valueType.isCovergroup() || valueType.isVoid()) {
        if (VariableSymbol::isKind(member.kind)) {
            if (!longestStaticPrefix)
                longestStaticPrefix = this;

            auto& var = member.as<VariableSymbol>();
            context.addDriver(var, *longestStaticPrefix, flags);

            return ValueExpressionBase::checkVariableAssignment(context,
                                                                member.as<VariableSymbol>(), flags,
                                                                location, sourceRange);
        }

        if (!location)
            location = sourceRange.start();

        auto& diag = context.addDiag(diag::ExpressionNotAssignable, location);
        diag.addNote(diag::NoteDeclarationHere, member.location);
        diag << sourceRange;
        return false;
    }

    if (VariableSymbol::isKind(member.kind) &&
        member.as<VariableSymbol>().flags.has(VariableFlags::ImmutableCoverageOption) &&
        !isWithinCovergroup(member, *context.scope)) {
        context.addDiag(diag::CoverOptionImmutable, location) << member.name;
        return false;
    }

    if (auto sym = value().getSymbolReference(); sym && sym->kind == SymbolKind::Net) {
        auto& net = sym->as<NetSymbol>();
        if (net.netType.netKind == NetType::UserDefined)
            context.addDiag(diag::UserDefPartialDriver, sourceRange) << net.name;
    }

    if (!longestStaticPrefix)
        longestStaticPrefix = this;

    return value().requireLValue(context, location, flags, longestStaticPrefix);
}